

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O0

void __thiscall
Iir::Butterworth::AnalogLowShelf::design(AnalogLowShelf *this,int numPoles,double gainDb)

{
  uint in_ESI;
  LayoutBase *in_RDI;
  PoleZeroPair *in_XMM0_Qa;
  LayoutBase *this_00;
  double dVar1;
  complex_t *pole;
  complex_t *zero;
  complex_t *unaff_retaddr;
  complex_t *in_stack_00000008;
  LayoutBase *in_stack_00000010;
  double theta;
  int i;
  int pairs;
  double gz;
  double gp;
  double g;
  double n2;
  double *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  complex<double> local_78;
  double local_60;
  double local_50;
  double local_48;
  int local_40;
  int local_3c;
  double local_38;
  
  if (((in_RDI[1].m_numPoles != in_ESI) || ((double)in_RDI[1].m_pair != (double)in_XMM0_Qa)) ||
     (NAN((double)in_RDI[1].m_pair) || NAN((double)in_XMM0_Qa))) {
    in_RDI[1].m_numPoles = in_ESI;
    in_RDI[1].m_pair = in_XMM0_Qa;
    LayoutBase::reset(in_RDI);
    this_00 = (LayoutBase *)(double)(int)(in_ESI << 1);
    dVar1 = pow(10.0,(double)in_XMM0_Qa / 20.0);
    pole = (complex_t *)pow(dVar1,1.0 / (double)this_00);
    zero = (complex_t *)(-1.0 / (double)pole);
    local_38 = -(double)pole;
    local_3c = (int)in_ESI / 2;
    for (local_40 = 1; local_40 <= local_3c; local_40 = local_40 + 1) {
      dVar1 = 0.5 - (double)(local_40 * 2 + -1) / (double)this_00;
      local_48 = dVar1 * 3.141592653589793;
      std::polar<double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_50 = dVar1;
      std::polar<double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_60 = dVar1;
      LayoutBase::addPoleZeroConjugatePairs(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
    if ((in_ESI & 1) != 0) {
      std::complex<double>::complex(&local_78,(double)zero,0.0);
      std::complex<double>::complex((complex<double> *)&stack0xffffffffffffff78,local_38,0.0);
      LayoutBase::add(this_00,pole,zero);
    }
  }
  return;
}

Assistant:

void AnalogLowShelf::design (int numPoles, double gainDb)
{
  if (m_numPoles != numPoles ||
      m_gainDb != gainDb)
  {
    m_numPoles = numPoles;
    m_gainDb = gainDb;

    reset ();

    const double n2 = numPoles * 2;
    const double g = pow (pow (10., gainDb/20), 1. / n2);
    const double gp = -1. / g;
    const double gz = -g;

    const int pairs = numPoles / 2;
    for (int i = 1; i <= pairs; ++i)
    {
      const double theta = doublePi * (0.5 - (2 * i - 1) / n2);
      addPoleZeroConjugatePairs (std::polar (gp, theta), std::polar (gz, theta));
    }
    
    if (numPoles & 1)
      add (gp, gz);
  }
}